

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_new.hpp
# Opt level: O0

const_reference_value __thiscall
Disa::Matrix_Sparse_Row<double,_int>::at(Matrix_Sparse_Row<double,_int> *this,index_type *column)

{
  bool bVar1;
  index_type __val;
  ostream *poVar2;
  iterator __first;
  difference_type __n;
  reference pdVar3;
  source_location *in_RCX;
  __normal_iterator<double_*,_std::span<double,_18446744073709551615UL>_> local_140;
  __normal_iterator<double_*,_std::span<double,_18446744073709551615UL>_> local_138;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> local_38;
  int *local_30;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> local_28;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> local_20;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> iter;
  index_type *column_local;
  Matrix_Sparse_Row<double,_int> *this_local;
  
  iter._M_current = column;
  local_28._M_current = (int *)std::span<int,_18446744073709551615UL>::begin(&this->i_column);
  local_30 = (int *)std::span<int,_18446744073709551615UL>::end(&this->i_column);
  local_20 = std::find<__gnu_cxx::__normal_iterator<int*,std::span<int,18446744073709551615ul>>,int>
                       (local_28,(__normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_>)
                                 local_30,iter._M_current);
  local_38._M_current = (int *)std::span<int,_18446744073709551615UL>::end(&this->i_column);
  bVar1 = __gnu_cxx::operator==<int_*,_std::span<int,_18446744073709551615UL>_>(&local_20,&local_38)
  ;
  if (!bVar1) {
    local_140._M_current = (double *)std::span<double,_18446744073709551615UL>::begin(&this->value);
    __first = std::span<int,_18446744073709551615UL>::begin(&this->i_column);
    __n = std::distance<__gnu_cxx::__normal_iterator<int*,std::span<int,18446744073709551615ul>>>
                    ((__normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_>)
                     __first._M_current,local_20);
    local_138 = __gnu_cxx::__normal_iterator<double_*,_std::span<double,_18446744073709551615UL>_>::
                operator+(&local_140,__n);
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::span<double,_18446744073709551615UL>_>::
             operator*(&local_138);
    return pdVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_60 = &PTR_s__workspace_llm4binary_github_lic_001b9268;
  console_format_abi_cxx11_(&local_58,(Disa *)0x0,(Log_Level)&local_60,in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  std::__cxx11::to_string(&local_110,*iter._M_current);
  std::operator+(&local_f0,"Column index ",&local_110);
  std::operator+(&local_d0,&local_f0,", is out of range for row ");
  __val = row(this);
  std::__cxx11::to_string(&local_130,__val);
  std::operator+(&local_b0,&local_d0,&local_130);
  std::operator+(&local_90,&local_b0,".");
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_58);
  exit(1);
}

Assistant:

[[nodiscard]] const_reference_value at(const index_type& column) const {
    auto iter = std::find(i_column.begin(), i_column.end(), column);
    ASSERT(iter != i_column.end(),
           "Column index " + std::to_string(column) + ", is out of range for row " + std::to_string(row()) + ".");
    return *(value.begin() + std::distance(i_column.begin(), iter));
  }